

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockContextNewFrameUpdateUndocking(ImGuiContext *ctx)

{
  ImVector<ImGuiWindow_*> *pIVar1;
  ImGuiID *pIVar2;
  ImGuiDockRequest *pIVar3;
  ImGuiDockNode *src_node;
  ImGuiDockNode *pIVar4;
  ImGuiWindow *window;
  ImGuiWindow *pIVar5;
  ImGuiWindow **ppIVar6;
  int iVar7;
  ImGuiDockNode *pIVar8;
  long lVar9;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  uint flags;
  ImGuiWindow **__dest;
  long lVar10;
  long lVar11;
  ImVec2 IVar12;
  
  if (((ctx->IO).ConfigFlags & 0x40) == 0) {
    if ((0 < (ctx->DockContext).Nodes.Data.Size) || (0 < (ctx->DockContext).Requests.Size)) {
      DockContextClearNodes(ctx,0,true);
      return;
    }
  }
  else {
    if (((ctx->IO).ConfigDockingNoSplit == true) &&
       (iVar7 = (ctx->DockContext).Nodes.Data.Size, 0 < iVar7)) {
      lVar10 = 8;
      lVar11 = 0;
      do {
        pIVar2 = *(ImGuiID **)((long)&((ctx->DockContext).Nodes.Data.Data)->key + lVar10);
        if (((pIVar2 != (ImGuiID *)0x0) && (*(long *)(pIVar2 + 6) == 0)) &&
           (*(long *)(pIVar2 + 8) != 0)) {
          DockBuilderRemoveNodeChildNodes(*pIVar2);
          iVar7 = (ctx->DockContext).Nodes.Data.Size;
          in_RDX = extraout_RDX;
        }
        lVar11 = lVar11 + 1;
        lVar10 = lVar10 + 0x10;
      } while (lVar11 < iVar7);
    }
    if ((ctx->DockContext).WantFullRebuild == true) {
      DockContextRebuildNodes(ctx);
      (ctx->DockContext).WantFullRebuild = false;
      in_RDX = extraout_RDX_00;
    }
    if (0 < (ctx->DockContext).Requests.Size) {
      lVar10 = 0;
      do {
        pIVar3 = (ctx->DockContext).Requests.Data;
        if (pIVar3[lVar10].Type == ImGuiDockRequestType_Undock) {
          if ((ImGuiContext *)pIVar3[lVar10].UndockTargetWindow == (ImGuiContext *)0x0) {
            src_node = pIVar3[lVar10].UndockTargetNode;
            if (src_node != (ImGuiDockNode *)0x0) {
              if (src_node->ChildNodes[0] != (ImGuiDockNode *)0x0) {
                __assert_fail("node->IsLeafNode()",
                              "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                              ,0x3443,
                              "void ImGui::DockContextProcessUndockNode(ImGuiContext *, ImGuiDockNode *)"
                             );
              }
              if ((src_node->Windows).Size < 1) {
                __assert_fail("node->Windows.Size >= 1",
                              "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                              ,0x3444,
                              "void ImGui::DockContextProcessUndockNode(ImGuiContext *, ImGuiDockNode *)"
                             );
              }
              pIVar8 = src_node->ParentNode;
              if ((pIVar8 == (ImGuiDockNode *)0x0) || ((src_node->MergedFlags & 0x800) != 0)) {
                pIVar8 = DockContextAddNode(ctx,0);
                pIVar8->Pos = src_node->Pos;
                pIVar8->Size = src_node->Size;
                pIVar8->SizeRef = src_node->SizeRef;
                DockNodeMoveWindows(pIVar8,src_node);
                DockSettingsRenameNodeReferences(src_node->ID,pIVar8->ID);
                if ((pIVar8->Windows).Size < 1) {
                  *(ushort *)&pIVar8->field_0xbc =
                       (ushort)*(undefined4 *)&pIVar8->field_0xbc & 0xffc0 | 9;
                  goto LAB_0012c669;
                }
                lVar11 = 0;
                do {
                  window = (pIVar8->Windows).Data[lVar11];
                  flags = window->Flags & 0xfeffffff;
                  window->Flags = flags;
                  pIVar5 = window->ParentWindow;
                  if (pIVar5 != (ImGuiWindow *)0x0) {
                    ppIVar6 = (pIVar5->DC).ChildWindows.Data;
                    lVar9 = (long)(pIVar5->DC).ChildWindows.Size;
                    __dest = ppIVar6;
                    if (0 < lVar9) {
                      do {
                        if (*__dest == window) break;
                        __dest = __dest + 1;
                      } while (__dest < ppIVar6 + lVar9);
                    }
                    if (__dest < ppIVar6 + lVar9) {
                      if (__dest < ppIVar6) {
                        __assert_fail("it >= Data && it < Data + Size",
                                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                                      ,0x71d,
                                      "T *ImVector<ImGuiWindow *>::erase(const T *) [T = ImGuiWindow *]"
                                     );
                      }
                      memmove(__dest,__dest + 1,
                              (((ulong)~((long)__dest - (long)ppIVar6) >> 3) + lVar9) * 8);
                      pIVar1 = &(pIVar5->DC).ChildWindows;
                      pIVar1->Size = pIVar1->Size + -1;
                      flags = window->Flags;
                    }
                  }
                  UpdateWindowParentAndRootLinks(window,flags,(ImGuiWindow *)0x0);
                  lVar11 = lVar11 + 1;
                  iVar7 = (pIVar8->Windows).Size;
                } while (lVar11 < iVar7);
              }
              else {
                pIVar4 = pIVar8->ChildNodes[0];
                if ((pIVar4 != src_node) && (pIVar8->ChildNodes[1] != src_node)) {
                  __assert_fail("node->ParentNode->ChildNodes[0] == node || node->ParentNode->ChildNodes[1] == node"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                                ,0x345c,
                                "void ImGui::DockContextProcessUndockNode(ImGuiContext *, ImGuiDockNode *)"
                               );
                }
                pIVar8->ChildNodes[pIVar4 != src_node] = (ImGuiDockNode *)0x0;
                DockNodeTreeMerge(ctx,src_node->ParentNode,
                                  src_node->ParentNode->ChildNodes[pIVar4 == src_node]);
                *(ushort *)&src_node->ParentNode->field_0xbc =
                     (ushort)*(undefined4 *)&src_node->ParentNode->field_0xbc & 0xfe3f | 0x80;
                src_node->ParentNode = (ImGuiDockNode *)0x0;
                iVar7 = (src_node->Windows).Size;
                pIVar8 = src_node;
              }
              *(ushort *)&pIVar8->field_0xbc =
                   (ushort)*(undefined4 *)&pIVar8->field_0xbc & 0xffc0 | 9;
              if (iVar7 < 1) {
LAB_0012c669:
                __assert_fail("i >= 0 && i < Size",
                              "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                              ,0x706,
                              "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
              }
              IVar12 = FixLargeWindowsWhenUndocking
                                 (&pIVar8->Size,
                                  &(*(pIVar8->Windows).Data)->Viewport->super_ImGuiViewport);
              pIVar8->Size = IVar12;
              pIVar8->field_0xbe = pIVar8->field_0xbe | 1;
              in_RDX = extraout_RDX_02;
              if (GImGui->SettingsDirtyTimer <= 0.0) {
                GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
              }
            }
          }
          else {
            DockContextProcessUndockWindow
                      ((ImGuiContext *)pIVar3[lVar10].UndockTargetWindow,(ImGuiWindow *)0x1,
                       SUB81(in_RDX,0));
            in_RDX = extraout_RDX_01;
          }
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < (ctx->DockContext).Requests.Size);
    }
  }
  return;
}

Assistant:

void ImGui::DockContextNewFrameUpdateUndocking(ImGuiContext* ctx)
{
    ImGuiContext& g = *ctx;
    ImGuiDockContext* dc  = &ctx->DockContext;
    if (!(g.IO.ConfigFlags & ImGuiConfigFlags_DockingEnable))
    {
        if (dc->Nodes.Data.Size > 0 || dc->Requests.Size > 0)
            DockContextClearNodes(ctx, 0, true);
        return;
    }

    // Setting NoSplit at runtime merges all nodes
    if (g.IO.ConfigDockingNoSplit)
        for (int n = 0; n < dc->Nodes.Data.Size; n++)
            if (ImGuiDockNode* node = (ImGuiDockNode*)dc->Nodes.Data[n].val_p)
                if (node->IsRootNode() && node->IsSplitNode())
                {
                    DockBuilderRemoveNodeChildNodes(node->ID);
                    //dc->WantFullRebuild = true;
                }

    // Process full rebuild
#if 0
    if (ImGui::IsKeyPressed(ImGui::GetKeyIndex(ImGuiKey_C)))
        dc->WantFullRebuild = true;
#endif
    if (dc->WantFullRebuild)
    {
        DockContextRebuildNodes(ctx);
        dc->WantFullRebuild = false;
    }

    // Process Undocking requests (we need to process them _before_ the UpdateMouseMovingWindowNewFrame call in NewFrame)
    for (int n = 0; n < dc->Requests.Size; n++)
    {
        ImGuiDockRequest* req = &dc->Requests[n];
        if (req->Type == ImGuiDockRequestType_Undock && req->UndockTargetWindow)
            DockContextProcessUndockWindow(ctx, req->UndockTargetWindow);
        else if (req->Type == ImGuiDockRequestType_Undock && req->UndockTargetNode)
            DockContextProcessUndockNode(ctx, req->UndockTargetNode);
    }
}